

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ITracker * __thiscall Catch::TestCaseTracking::TrackerContext::startRun(TrackerContext *this)

{
  element_type *peVar1;
  string *in_RDI;
  shared_ptr<Catch::TestCaseTracking::SectionTracker> *in_stack_ffffffffffffff48;
  SourceLineInfo *this_00;
  NameAndLocation *this_01;
  void **in_stack_ffffffffffffff78;
  TrackerContext *in_stack_ffffffffffffff80;
  NameAndLocation *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  string local_68 [104];
  
  this_01 = (NameAndLocation *)&stack0xffffffffffffff97;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             (allocator<char> *)in_stack_ffffffffffffff80);
  this_00 = (SourceLineInfo *)&stack0xffffffffffffff70;
  SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/dependencies/Catch2/single_include/catch2/catch.hpp"
             ,0x3822);
  NameAndLocation::NameAndLocation(this_01,in_RDI,this_00);
  std::
  make_shared<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::NameAndLocation,Catch::TestCaseTracking::TrackerContext&,decltype(nullptr)>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::shared_ptr<Catch::TestCaseTracking::ITracker>::operator=
            ((shared_ptr<Catch::TestCaseTracking::ITracker> *)this_00,in_stack_ffffffffffffff48);
  clara::std::shared_ptr<Catch::TestCaseTracking::SectionTracker>::~shared_ptr
            ((shared_ptr<Catch::TestCaseTracking::SectionTracker> *)0x124f6a);
  NameAndLocation::~NameAndLocation((NameAndLocation *)0x124f74);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  (in_RDI->field_2)._M_allocated_capacity = 0;
  *(undefined4 *)((long)&in_RDI->field_2 + 8) = 1;
  peVar1 = clara::std::
           __shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this_00);
  return peVar1;
}

Assistant:

ITracker& TrackerContext::startRun() {
        m_rootTracker = std::make_shared<SectionTracker>( NameAndLocation( "{root}", CATCH_INTERNAL_LINEINFO ), *this, nullptr );
        m_currentTracker = nullptr;
        m_runState = Executing;
        return *m_rootTracker;
    }